

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

DdNode * Cudd_SubsetWithMaskVars
                   (DdManager *dd,DdNode *f,DdNode **vars,int nvars,DdNode **maskVars,int mvars)

{
  int iVar1;
  DdNode *pDVar2;
  double *weight_00;
  char *string_00;
  void *__ptr;
  void *__ptr_00;
  double dVar3;
  DdNode *support;
  DdNode *cof;
  DdNode *subset;
  DdNode *newCube;
  DdNode *cube;
  DdNode *zero;
  int result;
  int *mask;
  int *indices;
  int size;
  int i;
  char *string;
  double *weight;
  int mvars_local;
  DdNode **maskVars_local;
  int nvars_local;
  DdNode **vars_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  pDVar2 = Cudd_Support(dd,f);
  *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
       *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
  Cudd_RecursiveDeref(dd,pDVar2);
  iVar1 = dd->size;
  weight_00 = (double *)malloc((long)iVar1 << 3);
  if (weight_00 == (double *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    dd_local = (DdManager *)0x0;
  }
  else {
    for (indices._4_4_ = 0; indices._4_4_ < iVar1; indices._4_4_ = indices._4_4_ + 1) {
      weight_00[indices._4_4_] = 0.0;
    }
    for (indices._4_4_ = 0; indices._4_4_ < mvars; indices._4_4_ = indices._4_4_ + 1) {
      pDVar2 = Cudd_Cofactor(dd,f,maskVars[indices._4_4_]);
      *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
      dVar3 = Cudd_CountMinterm(dd,pDVar2,nvars);
      weight_00[indices._4_4_] = dVar3;
      Cudd_RecursiveDeref(dd,pDVar2);
      pDVar2 = Cudd_Cofactor(dd,f,(DdNode *)((ulong)maskVars[indices._4_4_] ^ 1));
      *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
      dVar3 = Cudd_CountMinterm(dd,pDVar2,nvars);
      weight_00[indices._4_4_] = weight_00[indices._4_4_] - dVar3;
      Cudd_RecursiveDeref(dd,pDVar2);
    }
    string_00 = (char *)malloc((long)(iVar1 + 1));
    if (string_00 == (char *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      if (weight_00 != (double *)0x0) {
        free(weight_00);
      }
      dd_local = (DdManager *)0x0;
    }
    else {
      __ptr = malloc((long)iVar1 << 2);
      if (__ptr == (void *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
        if (weight_00 != (double *)0x0) {
          free(weight_00);
        }
        if (string_00 != (char *)0x0) {
          free(string_00);
        }
        dd_local = (DdManager *)0x0;
      }
      else {
        for (indices._4_4_ = 0; indices._4_4_ < iVar1; indices._4_4_ = indices._4_4_ + 1) {
          string_00[indices._4_4_] = '2';
          *(undefined4 *)((long)__ptr + (long)indices._4_4_ * 4) = 0;
        }
        string_00[iVar1] = '\0';
        __ptr_00 = malloc((long)nvars << 2);
        if (__ptr_00 == (void *)0x0) {
          dd->errorCode = CUDD_MEMORY_OUT;
          if (weight_00 != (double *)0x0) {
            free(weight_00);
          }
          if (string_00 != (char *)0x0) {
            free(string_00);
          }
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          dd_local = (DdManager *)0x0;
        }
        else {
          for (indices._4_4_ = 0; indices._4_4_ < nvars; indices._4_4_ = indices._4_4_ + 1) {
            *(DdHalfWord *)((long)__ptr_00 + (long)indices._4_4_ * 4) = vars[indices._4_4_]->index;
          }
          iVar1 = ddPickRepresentativeCube(dd,f,weight_00,string_00);
          if (iVar1 == 0) {
            if (weight_00 != (double *)0x0) {
              free(weight_00);
            }
            if (string_00 != (char *)0x0) {
              free(string_00);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (__ptr_00 != (void *)0x0) {
              free(__ptr_00);
            }
            dd_local = (DdManager *)0x0;
          }
          else {
            newCube = Cudd_ReadOne(dd);
            *(int *)(((ulong)newCube & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)newCube & 0xfffffffffffffffe) + 4) + 1;
            pDVar2 = Cudd_ReadOne(dd);
            for (indices._4_4_ = 0; indices._4_4_ < nvars; indices._4_4_ = indices._4_4_ + 1) {
              if (string_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] == '0') {
                subset = Cudd_bddIte(dd,newCube,(DdNode *)((ulong)vars[indices._4_4_] ^ 1),
                                     (DdNode *)((ulong)pDVar2 ^ 1));
LAB_00a635a7:
                if (subset == (DdNode *)0x0) {
                  if (weight_00 != (double *)0x0) {
                    free(weight_00);
                  }
                  if (string_00 != (char *)0x0) {
                    free(string_00);
                  }
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                  if (__ptr_00 != (void *)0x0) {
                    free(__ptr_00);
                  }
                  Cudd_RecursiveDeref(dd,newCube);
                  return (DdNode *)0x0;
                }
                *(int *)(((ulong)subset & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)subset & 0xfffffffffffffffe) + 4) + 1;
                Cudd_RecursiveDeref(dd,newCube);
                newCube = subset;
              }
              else if (string_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] == '1') {
                subset = Cudd_bddIte(dd,newCube,vars[indices._4_4_],(DdNode *)((ulong)pDVar2 ^ 1));
                goto LAB_00a635a7;
              }
            }
            Cudd_RecursiveDeref(dd,newCube);
            for (indices._4_4_ = 0; indices._4_4_ < mvars; indices._4_4_ = indices._4_4_ + 1) {
              *(undefined4 *)((long)__ptr + (ulong)maskVars[indices._4_4_]->index * 4) = 1;
            }
            for (indices._4_4_ = 0; indices._4_4_ < nvars; indices._4_4_ = indices._4_4_ + 1) {
              if (*(int *)((long)__ptr +
                          (long)*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4) * 4) == 0) {
                string_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] = '2';
              }
              else if (string_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] == '2') {
                if (weight_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] < 0.0) {
                  string_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] = '0';
                }
                else {
                  string_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] = '1';
                }
              }
            }
            newCube = Cudd_ReadOne(dd);
            *(int *)(((ulong)newCube & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)newCube & 0xfffffffffffffffe) + 4) + 1;
            pDVar2 = Cudd_ReadOne(dd);
            for (indices._4_4_ = 0; indices._4_4_ < nvars; indices._4_4_ = indices._4_4_ + 1) {
              if (string_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] == '0') {
                subset = Cudd_bddIte(dd,newCube,(DdNode *)((ulong)vars[indices._4_4_] ^ 1),
                                     (DdNode *)((ulong)pDVar2 ^ 1));
LAB_00a63827:
                if (subset == (DdNode *)0x0) {
                  if (weight_00 != (double *)0x0) {
                    free(weight_00);
                  }
                  if (string_00 != (char *)0x0) {
                    free(string_00);
                  }
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                  if (__ptr_00 != (void *)0x0) {
                    free(__ptr_00);
                  }
                  Cudd_RecursiveDeref(dd,newCube);
                  return (DdNode *)0x0;
                }
                *(int *)(((ulong)subset & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)subset & 0xfffffffffffffffe) + 4) + 1;
                Cudd_RecursiveDeref(dd,newCube);
                newCube = subset;
              }
              else if (string_00[*(int *)((long)__ptr_00 + (long)indices._4_4_ * 4)] == '1') {
                subset = Cudd_bddIte(dd,newCube,vars[indices._4_4_],(DdNode *)((ulong)pDVar2 ^ 1));
                goto LAB_00a63827;
              }
            }
            cof = Cudd_bddAnd(dd,f,newCube);
            *(int *)(((ulong)cof & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)cof & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,newCube);
            iVar1 = Cudd_bddLeq(dd,cof,f);
            if (iVar1 == 0) {
              Cudd_RecursiveDeref(dd,cof);
              cof = (DdNode *)0x0;
            }
            else {
              *(int *)(((ulong)cof & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)cof & 0xfffffffffffffffe) + 4) + -1;
            }
            if (weight_00 != (double *)0x0) {
              free(weight_00);
            }
            if (string_00 != (char *)0x0) {
              free(string_00);
            }
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            if (__ptr_00 != (void *)0x0) {
              free(__ptr_00);
            }
            dd_local = (DdManager *)cof;
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_SubsetWithMaskVars(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick a cube */,
  DdNode ** vars /* array of variables */,
  int  nvars /* size of <code>vars</code> */,
  DdNode ** maskVars /* array of variables */,
  int  mvars /* size of <code>maskVars</code> */)
{
    double      *weight;
    char        *string;
    int         i, size;
    int         *indices, *mask;
    int         result;
    DdNode      *zero, *cube, *newCube, *subset;
    DdNode      *cof;

    DdNode      *support;
    support = Cudd_Support(dd,f);
    cuddRef(support);
    Cudd_RecursiveDeref(dd,support);

    zero = Cudd_Not(dd->one);
    size = dd->size;

    weight = ABC_ALLOC(double,size);
    if (weight == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        weight[i] = 0.0;
    }
    for (i = 0; i < mvars; i++) {
        cof = Cudd_Cofactor(dd, f, maskVars[i]);
        cuddRef(cof);
        weight[i] = Cudd_CountMinterm(dd, cof, nvars);
        Cudd_RecursiveDeref(dd,cof);

        cof = Cudd_Cofactor(dd, f, Cudd_Not(maskVars[i]));
        cuddRef(cof);
        weight[i] -= Cudd_CountMinterm(dd, cof, nvars);
        Cudd_RecursiveDeref(dd,cof);
    }

    string = ABC_ALLOC(char, size + 1);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        return(NULL);
    }
    mask = ABC_ALLOC(int, size);
    if (mask == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        ABC_FREE(string);
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        string[i] = '2';
        mask[i] = 0;
    }
    string[size] = '\0';
    indices = ABC_ALLOC(int,nvars);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        ABC_FREE(string);
        ABC_FREE(mask);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) {
        indices[i] = vars[i]->index;
    }

    result = ddPickRepresentativeCube(dd,f,weight,string);
    if (result == 0) {
        ABC_FREE(weight);
        ABC_FREE(string);
        ABC_FREE(mask);
        ABC_FREE(indices);
        return(NULL);
    }

    cube = Cudd_ReadOne(dd);
    cuddRef(cube);
    zero = Cudd_Not(Cudd_ReadOne(dd));
    for (i = 0; i < nvars; i++) {
        if (string[indices[i]] == '0') {
            newCube = Cudd_bddIte(dd,cube,Cudd_Not(vars[i]),zero);
        } else if (string[indices[i]] == '1') {
            newCube = Cudd_bddIte(dd,cube,vars[i],zero);
        } else
            continue;
        if (newCube == NULL) {
            ABC_FREE(weight);
            ABC_FREE(string);
            ABC_FREE(mask);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(newCube);
        Cudd_RecursiveDeref(dd,cube);
        cube = newCube;
    }
    Cudd_RecursiveDeref(dd,cube);

    for (i = 0; i < mvars; i++) {
        mask[maskVars[i]->index] = 1;
    }
    for (i = 0; i < nvars; i++) {
        if (mask[indices[i]]) {
            if (string[indices[i]] == '2') {
                if (weight[indices[i]] >= 0.0)
                    string[indices[i]] = '1';
                else
                    string[indices[i]] = '0';
            }
        } else {
            string[indices[i]] = '2';
        }
    }

    cube = Cudd_ReadOne(dd);
    cuddRef(cube);
    zero = Cudd_Not(Cudd_ReadOne(dd));

    /* Build result BDD. */
    for (i = 0; i < nvars; i++) {
        if (string[indices[i]] == '0') {
            newCube = Cudd_bddIte(dd,cube,Cudd_Not(vars[i]),zero);
        } else if (string[indices[i]] == '1') {
            newCube = Cudd_bddIte(dd,cube,vars[i],zero);
        } else
            continue;
        if (newCube == NULL) {
            ABC_FREE(weight);
            ABC_FREE(string);
            ABC_FREE(mask);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(newCube);
        Cudd_RecursiveDeref(dd,cube);
        cube = newCube;
    }

    subset = Cudd_bddAnd(dd,f,cube);
    cuddRef(subset);
    Cudd_RecursiveDeref(dd,cube);

    /* Test. */
    if (Cudd_bddLeq(dd,subset,f)) {
        cuddDeref(subset);
    } else {
        Cudd_RecursiveDeref(dd,subset);
        subset = NULL;
    }

    ABC_FREE(weight);
    ABC_FREE(string);
    ABC_FREE(mask);
    ABC_FREE(indices);
    return(subset);

}